

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::TrimWhitespace(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  allocator<char> local_69;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  const_iterator stop;
  allocator local_31;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  const_iterator start;
  string *s_local;
  
  start._M_current = (char *)s;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_28._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    bVar2 = false;
    if (bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      bVar2 = *pcVar3 < '!';
    }
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  local_30._M_current = (char *)std::__cxx11::string::end();
  bVar2 = __gnu_cxx::operator==(&local_20,&local_30);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    local_58._M_current = (char *)std::__cxx11::string::end();
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-(&local_58,1);
    while (pcVar3 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_50), *pcVar3 < '!') {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(&local_50);
    }
    local_60._M_current = local_20._M_current;
    local_68 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_50,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)__return_storage_ptr__,local_60,local_68,&local_69);
    std::allocator<char>::~allocator(&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while(start != s.end() && *start <= ' ')
    ++start;
  if (start == s.end())
    return "";

  std::string::const_iterator stop = s.end()-1;
  while(*stop <= ' ')
    --stop;
  return std::string(start, stop+1);
}